

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi_failure_tests.cpp
# Opt level: O0

void __thiscall
iu_SPIExpectNonFailureTest_x_iutest_x_Substr_Test::Body
          (iu_SPIExpectNonFailureTest_x_iutest_x_Substr_Test *this)

{
  bool bVar1;
  char *message;
  AssertionHelper local_208;
  Fixed local_1d8;
  anon_class_1_0_00000001 local_39;
  undefined1 local_38 [8];
  AssertionResult iutest_spi_ar;
  iu_SPIExpectNonFailureTest_x_iutest_x_Substr_Test *this_local;
  
  iutest_spi_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  Body::anon_class_1_0_00000001::operator()((AssertionResult *)local_38,&local_39);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    message = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_failure_tests.cpp"
               ,0x71,message,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_208,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper(&local_208);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

IUTEST(SPIExpectNonFailureTest, Substr)
{
    IUTEST_EXPECT_NONFATAL_FAILURE(NonFatalFailure1(); , "aaaa");
}